

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxpool.h
# Opt level: O1

void __thiscall cxxpool::thread_pool::~thread_pool(thread_pool *this)

{
  pointer puVar1;
  int in_EDX;
  int in_ESI;
  
  shutdown(this,in_ESI,in_EDX);
  std::condition_variable::~condition_variable(&this->task_cond_var_);
  puVar1 = (this->task_counter_).count_.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->task_counter_).count_.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  std::vector<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>::
  ~vector(&(this->tasks_).c);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&this->threads_);
  return;
}

Assistant:

~thread_pool() {
        shutdown();
    }